

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O3

void parse_output_preds(options_i *options,vw *all)

{
  vw_ostream *pvVar1;
  _func_int **pp_Var2;
  _Alloc_hider __s;
  vw *pvVar3;
  int iVar4;
  option_group_definition *this;
  ostream *poVar5;
  size_t sVar6;
  string raw_predictions;
  string predictions;
  option_group_definition output_options;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  vw *local_3d0;
  undefined1 *local_3c8 [2];
  undefined1 local_3b8 [16];
  string local_3a8;
  undefined1 *local_388;
  long local_380;
  undefined1 local_378 [16];
  option_group_definition local_368;
  undefined1 *local_330 [2];
  undefined1 local_320 [16];
  string local_310;
  undefined1 *local_2f0 [2];
  undefined1 local_2e0 [16];
  undefined1 *local_2d0 [2];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [80];
  string local_260 [56];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_228;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_218;
  undefined1 local_210 [80];
  string local_1c0 [56];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_188;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_178;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  
  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
  local_3f0._M_string_length = 0;
  local_3f0.field_2._M_local_buf[0] = '\0';
  local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
  local_410._M_string_length = 0;
  local_410.field_2._M_local_buf[0] = '\0';
  local_388 = local_378;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"Output options","");
  local_368.m_name._M_dataplus._M_p = (pointer)&local_368.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_368,local_388,local_388 + local_380);
  local_368.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_368.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_368.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3d0 = all;
  if (local_388 != local_378) {
    operator_delete(local_388);
  }
  local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"predictions","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_2b0,&local_3a8,&local_3f0);
  local_2d0[0] = local_2c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"p","");
  std::__cxx11::string::_M_assign(local_260);
  local_2f0[0] = local_2e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2f0,"File to output predictions to","");
  std::__cxx11::string::_M_assign((string *)(local_2b0 + 0x30));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_d0,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_2b0);
  this = VW::config::option_group_definition::add<std::__cxx11::string>(&local_368,&local_d0);
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"raw_predictions","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_210,&local_310,&local_410);
  local_3c8[0] = local_3b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"r","");
  std::__cxx11::string::_M_assign(local_1c0);
  local_330[0] = local_320;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_330,"File to output unnormalized predictions to","");
  std::__cxx11::string::_M_assign((string *)(local_210 + 0x30));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_170,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_210);
  VW::config::option_group_definition::add<std::__cxx11::string>(this,&local_170);
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d4190;
  if (local_170.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_170.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if (local_330[0] != local_320) {
    operator_delete(local_330[0]);
  }
  if (local_3c8[0] != local_3b8) {
    operator_delete(local_3c8[0]);
  }
  local_210._0_8_ = &PTR__typed_option_002d4190;
  if (local_178._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_178._M_pi);
  }
  if (local_188._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_188._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d4190;
  if (local_d0.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_d0.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_2f0[0] != local_2e0) {
    operator_delete(local_2f0[0]);
  }
  if (local_2d0[0] != local_2c0) {
    operator_delete(local_2d0[0]);
  }
  local_2b0._0_8_ = &PTR__typed_option_002d4190;
  if (local_218._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_218._M_pi);
  }
  if (local_228._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_228._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_368);
  pvVar3 = local_3d0;
  pp_Var2 = (_func_int **)(local_2b0 + 0x10);
  local_2b0._0_8_ = pp_Var2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"predictions","");
  iVar4 = (*options->_vptr_options_i[1])(options,local_2b0);
  if ((_func_int **)local_2b0._0_8_ != pp_Var2) {
    operator_delete((void *)local_2b0._0_8_);
  }
  if ((char)iVar4 != '\0') {
    if (pvVar3->quiet == false) {
      std::__ostream_insert<char,std::char_traits<char>>
                (&(pvVar3->trace_message).super_ostream,"predictions = ",0xe);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (&(pvVar3->trace_message).super_ostream,local_3f0._M_dataplus._M_p,
                          local_3f0._M_string_length);
      std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    iVar4 = std::__cxx11::string::compare((char *)&local_3f0);
    __s._M_p = local_3f0._M_dataplus._M_p;
    if (iVar4 == 0) {
      local_2b0._0_4_ = 1;
      v_array<int>::push_back(&pvVar3->final_prediction_sink,(int *)local_2b0);
    }
    else {
      iVar4 = open64(local_3f0._M_dataplus._M_p,0x241,0x1b6);
      if (iVar4 < 0) {
        pvVar1 = &pvVar3->trace_message;
        std::__ostream_insert<char,std::char_traits<char>>
                  (&pvVar1->super_ostream,"Error opening the predictions file: ",0x24);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__s._M_p ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          std::ios::clear((int)pvVar1 + (int)(pvVar1->super_ostream)._vptr_basic_ostream[-3]);
        }
        else {
          sVar6 = strlen(__s._M_p);
          std::__ostream_insert<char,std::char_traits<char>>(&pvVar1->super_ostream,__s._M_p,sVar6);
        }
        std::ios::widen((char)(pvVar1->super_ostream)._vptr_basic_ostream[-3] + (char)pvVar1);
        std::ostream::put((char)pvVar1);
        std::ostream::flush();
      }
      local_2b0._0_4_ = iVar4;
      v_array<int>::push_back(&pvVar3->final_prediction_sink,(int *)local_2b0);
    }
  }
  local_2b0._0_8_ = pp_Var2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"raw_predictions","");
  iVar4 = (*options->_vptr_options_i[1])(options,local_2b0);
  if ((_func_int **)local_2b0._0_8_ != pp_Var2) {
    operator_delete((void *)local_2b0._0_8_);
  }
  if ((char)iVar4 != '\0') {
    if (pvVar3->quiet == false) {
      pvVar1 = &pvVar3->trace_message;
      std::__ostream_insert<char,std::char_traits<char>>
                (&pvVar1->super_ostream,"raw predictions = ",0x12);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (&pvVar1->super_ostream,local_410._M_dataplus._M_p,
                          local_410._M_string_length);
      std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      local_2b0._0_8_ = pp_Var2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"binary","");
      iVar4 = (*options->_vptr_options_i[1])(options,local_2b0);
      if ((_func_int **)local_2b0._0_8_ != pp_Var2) {
        operator_delete((void *)local_2b0._0_8_);
      }
      if ((char)iVar4 != '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  (&pvVar1->super_ostream,
                   "Warning: --raw_predictions has no defined value when --binary specified, expect no output"
                   ,0x59);
        std::ios::widen((char)(pvVar1->super_ostream)._vptr_basic_ostream[-3] + (char)pvVar1);
        std::ostream::put((char)pvVar1);
        std::ostream::flush();
      }
    }
    iVar4 = std::__cxx11::string::compare((char *)&local_410);
    if (iVar4 == 0) {
      iVar4 = 1;
    }
    else {
      iVar4 = open64(local_410._M_dataplus._M_p,0x241,0x1b6);
    }
    pvVar3->raw_prediction = iVar4;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_368.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368.m_name._M_dataplus._M_p != &local_368.m_name.field_2) {
    operator_delete(local_368.m_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void parse_output_preds(options_i& options, vw& all)
{
  std::string predictions;
  std::string raw_predictions;

  option_group_definition output_options("Output options");
  output_options.add(make_option("predictions", predictions).short_name("p").help("File to output predictions to"))
      .add(make_option("raw_predictions", raw_predictions)
               .short_name("r")
               .help("File to output unnormalized predictions to"));
  options.add_and_parse(output_options);

  if (options.was_supplied("predictions"))
  {
    if (!all.quiet)
      all.trace_message << "predictions = " << predictions << endl;

    if (predictions == "stdout")
    {
      all.final_prediction_sink.push_back((size_t)1);  // stdout
    }
    else
    {
      const char* fstr = predictions.c_str();
      int f;
      // TODO can we migrate files to fstreams?
#ifdef _WIN32
      _sopen_s(&f, fstr, _O_CREAT | _O_WRONLY | _O_BINARY | _O_TRUNC, _SH_DENYWR, _S_IREAD | _S_IWRITE);
#else
      f = open(fstr, O_CREAT | O_WRONLY | O_LARGEFILE | O_TRUNC, 0666);
#endif
      if (f < 0)
        all.trace_message << "Error opening the predictions file: " << fstr << endl;
      all.final_prediction_sink.push_back((size_t)f);
    }
  }

  if (options.was_supplied("raw_predictions"))
  {
    if (!all.quiet)
    {
      all.trace_message << "raw predictions = " << raw_predictions << endl;
      if (options.was_supplied("binary"))
        all.trace_message << "Warning: --raw_predictions has no defined value when --binary specified, expect no output"
                          << endl;
    }
    if (raw_predictions == "stdout")
      all.raw_prediction = 1;  // stdout
    else
    {
      const char* t = raw_predictions.c_str();
      int f;
#ifdef _WIN32
      _sopen_s(&f, t, _O_CREAT | _O_WRONLY | _O_BINARY | _O_TRUNC, _SH_DENYWR, _S_IREAD | _S_IWRITE);
#else
      f = open(t, O_CREAT | O_WRONLY | O_LARGEFILE | O_TRUNC, 0666);
#endif
      all.raw_prediction = f;
    }
  }
}